

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O1

CURLcode Curl_output_digest(connectdata *conn,_Bool proxy,uchar *request,uchar *uripath)

{
  Curl_easy *data;
  bool bVar1;
  char **ppcVar2;
  byte bVar3;
  CURLcode CVar4;
  char *pcVar5;
  uchar *uripath_00;
  int iVar6;
  undefined7 in_register_00000031;
  char **ppcVar7;
  long lVar8;
  char *pcVar9;
  char *userp;
  uint uVar10;
  char *response;
  long local_48;
  uchar *local_40;
  size_t len;
  
  data = conn->data;
  iVar6 = (int)CONCAT71(in_register_00000031,proxy);
  uVar10 = iVar6 << 5;
  ppcVar2 = &conn->user;
  ppcVar7 = &conn->passwd;
  lVar8 = 0x1740;
  if (iVar6 != 0) {
    lVar8 = 0x1728;
    ppcVar7 = &(conn->http_proxy).passwd;
    ppcVar2 = &(conn->http_proxy).user;
  }
  pcVar9 = *ppcVar7;
  userp = *ppcVar2;
  local_40 = request;
  (*Curl_cfree)(*(void **)((long)data->sockets + lVar8 + -0x80));
  if (userp == (char *)0x0) {
    userp = "";
  }
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "";
  }
  *(undefined8 *)((long)data->sockets + lVar8 + -0x80) = 0;
  bVar3 = (&(data->state).authhost.field_0x18)[uVar10];
  if (*(long *)((long)&(data->state).digest.nonce + (ulong)(uint)(iVar6 << 6)) == 0) {
    bVar3 = bVar3 & 0xfe;
  }
  else {
    bVar1 = true;
    local_48 = lVar8;
    if (((bVar3 & 4) == 0) || (pcVar5 = strchr((char *)uripath,0x3f), pcVar5 == (char *)0x0)) {
      uripath_00 = (uchar *)0x0;
    }
    else {
      bVar1 = false;
      uripath_00 = (uchar *)curl_maprintf("%.*s",(long)pcVar5 - (long)uripath,uripath);
    }
    if (bVar1) {
      uripath_00 = (uchar *)(*Curl_cstrdup)((char *)uripath);
    }
    if (uripath_00 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar4 = Curl_auth_create_digest_http_message
                      (data,userp,pcVar9,local_40,uripath_00,
                       (digestdata *)((long)&(data->state).digest.nonce + (ulong)(uint)(iVar6 << 6))
                       ,&response,&len);
    (*Curl_cfree)(uripath_00);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pcVar9 = "";
    if (proxy) {
      pcVar9 = "Proxy-";
    }
    pcVar9 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar9,response);
    lVar8 = local_48;
    *(char **)((long)data->sockets + local_48 + -0x80) = pcVar9;
    (*Curl_cfree)(response);
    if (*(long *)((long)data->sockets + lVar8 + -0x80) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    bVar3 = (&(data->state).authhost.field_0x18)[uVar10] | 1;
  }
  (&(data->state).authhost.field_0x18)[uVar10] = bVar3;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct connectdata *conn,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
#ifdef CURL_DISABLE_PROXY
    return CURLE_NOT_BUILT_IN;
#else
    digest = &data->state.proxydigest;
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    authp = &data->state.authproxy;
#endif
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &data->state.aptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      path = (unsigned char *) aprintf("%.*s", urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}